

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

void __thiscall
despot::Planner::EvaluationLoop
          (Planner *this,DSPOMDP *model,World *world,Belief *belief,string *belief_type,
          Solver **solver,Logger *logger,Option *options,clock_t main_clock_start,int num_runs,
          int start_run)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  Belief *pBVar3;
  log_ostream *plVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar5;
  long lVar6;
  double extraout_XMM0_Qa;
  vector<double,_std::allocator<double>_> round_rewards;
  allocator_type local_9d;
  int local_9c;
  double local_98;
  double local_90;
  DSPOMDP *local_88;
  string *local_80;
  long local_78;
  long local_70;
  _Vector_base<double,_std::allocator<double>_> local_68;
  string local_50 [32];
  
  lVar6 = (long)start_run;
  local_88 = model;
  local_80 = belief_type;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_68,(long)num_runs,&local_9d);
  local_9c = 1;
  local_78 = (long)(num_runs + start_run);
  do {
    if (local_78 <= lVar6) {
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
      return;
    }
    this->round_ = (int)lVar6;
    this->step_ = 0;
    if (DAT_0019fe20 == '\0') {
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar2 = std::operator<<(poVar2,"####################################### Round ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar6);
      poVar2 = std::operator<<(poVar2," #######################################");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    (*world->_vptr_World[3])(world);
    iVar1 = (*world->_vptr_World[4])(world);
    (*logger->_vptr_Logger[2])(logger,CONCAT44(extraout_var,iVar1));
    local_90 = get_time_second();
    pBVar3 = Solver::belief(*solver);
    local_70 = lVar6;
    if (pBVar3 != (Belief *)0x0) {
      (*pBVar3->_vptr_Belief[1])(pBVar3);
    }
    local_98 = get_time_second();
    iVar1 = logging::level();
    if (local_9c <= iVar1) {
      iVar1 = logging::level();
      if (2 < iVar1) {
        plVar4 = logging::stream(3);
        std::operator<<(&plVar4->super_ostream,
                        "[Initializer::EvaluationLoop] Deleted old belief in ");
        poVar2 = std::ostream::_M_insert<double>(local_98 - local_90);
        poVar2 = std::operator<<(poVar2,"s");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    local_90 = get_time_second();
    iVar1 = (*world->_vptr_World[4])(world);
    std::__cxx11::string::string(local_50,(string *)local_80);
    iVar1 = (*local_88->_vptr_DSPOMDP[9])(local_88,CONCAT44(extraout_var_00,iVar1),local_50);
    pBVar3 = (Belief *)CONCAT44(extraout_var_01,iVar1);
    std::__cxx11::string::~string(local_50);
    local_98 = get_time_second();
    iVar1 = logging::level();
    if (local_9c <= iVar1) {
      iVar1 = logging::level();
      if (2 < iVar1) {
        plVar4 = logging::stream(3);
        poVar2 = std::operator<<(&plVar4->super_ostream,
                                 "[Initializer::EvaluationLoop] Created intial belief ");
        if (pBVar3 == (Belief *)0x0) {
          uVar5 = __cxa_bad_typeid();
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
          _Unwind_Resume(uVar5);
        }
        poVar2 = std::operator<<(poVar2,*(char **)(pBVar3->_vptr_Belief[-1] + 8) +
                                        (**(char **)(pBVar3->_vptr_Belief[-1] + 8) == '*'));
        std::operator<<(poVar2," in ");
        poVar2 = std::ostream::_M_insert<double>(local_98 - local_90);
        poVar2 = std::operator<<(poVar2,"s");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    (*(*solver)->_vptr_Solver[4])(*solver,pBVar3);
    logger->belief_ = pBVar3;
    (*(this->super_PlannerBase)._vptr_PlannerBase[8])(this,solver,world,logger);
    if (DAT_0019fe20 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cout,"Simulation terminated in ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,logger->step_);
      poVar2 = std::operator<<(poVar2," steps");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    (*logger->_vptr_Logger[3])(logger);
    local_68._M_impl.super__Vector_impl_data._M_start[local_70] = extraout_XMM0_Qa;
    lVar6 = local_70 + 1;
  } while( true );
}

Assistant:

void Planner::EvaluationLoop(DSPOMDP *model, World* world, Belief* belief,
		string belief_type, Solver *&solver, Logger *logger,
		option::Option *options, clock_t main_clock_start, int num_runs,
		int start_run) {
	// Run num_runs simulations
	vector<double> round_rewards(num_runs);
	for (int round = start_run; round < start_run + num_runs; round++) {
		round_=round;
		step_=0;
		default_out<< endl
		<< "####################################### Round " << round
		<< " #######################################" << endl;
		//Reset world and logger
		world->Initialize();
		logger->InitRound(world->GetCurrentState());

		//Reset belief and solver
		double start_t = get_time_second();
		delete solver->belief();
		double end_t = get_time_second();
		logi << "[Initializer::EvaluationLoop] Deleted old belief in "
		<< (end_t - start_t) << "s" << endl;

		start_t = get_time_second();
		belief=model->InitialBelief(world->GetCurrentState(), belief_type);
		end_t = get_time_second();
		logi << "[Initializer::EvaluationLoop] Created intial belief "
		<< typeid(*belief).name() << " in " << (end_t - start_t) << "s" << endl;

		solver->belief(belief);
		logger->belief(belief);

		//start loop
		PlanningLoop(solver, world, logger);
		//end loop

		default_out << "Simulation terminated in " << logger->step() << " steps"
		<< endl;
		double round_reward = logger->EndRound();
		round_rewards[round] = round_reward;
	}
}